

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geom.cpp
# Opt level: O2

MatrixXd *
ear::toPositionsMatrix
          (MatrixXd *__return_storage_ptr__,
          vector<ear::PolarPosition,_std::allocator<ear::PolarPosition>_> *positions)

{
  pointer pPVar1;
  uint uVar2;
  ulong i;
  Vector3d local_80;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> local_68;
  
  local_68.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.m_data =
       (PointerType)
       (((long)(positions->
               super__Vector_base<ear::PolarPosition,_std::allocator<ear::PolarPosition>_>)._M_impl.
               super__Vector_impl_data._M_finish -
        (long)(positions->
              super__Vector_base<ear::PolarPosition,_std::allocator<ear::PolarPosition>_>)._M_impl.
              super__Vector_impl_data._M_start) / 0x18);
  local_80.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0].
  _0_4_ = 3;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<unsigned_long,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,(unsigned_long *)&local_68,
             (int *)&local_80);
  uVar2 = 0;
  while( true ) {
    i = (ulong)uVar2;
    pPVar1 = (positions->super__Vector_base<ear::PolarPosition,_std::allocator<ear::PolarPosition>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(positions->
                       super__Vector_base<ear::PolarPosition,_std::allocator<ear::PolarPosition>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pPVar1) / 0x18) <= i)
    break;
    cart(&local_80,pPVar1[i].azimuth,pPVar1[i].elevation,pPVar1[i].distance);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
              (&local_68,__return_storage_ptr__,i);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,Eigen::Matrix<double,3,1,0,3,1>>
              (&local_68,&local_80);
    uVar2 = uVar2 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

Eigen::MatrixXd toPositionsMatrix(
      const std::vector<PolarPosition>& positions) {
    Eigen::MatrixXd ret(positions.size(), 3);
    for (unsigned int i = 0; i < positions.size(); ++i) {
      ret.row(i) = toCartesianVector3d(positions[i]);
    }
    return ret;
  }